

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse4_1::c_imm_v64_shl_n_8<1>(c_v64 a)

{
  c_v64 cVar1;
  
  cVar1.u8[1] = a.u8[1] * '\x02';
  cVar1.u8[0] = a.u8[0] * '\x02';
  cVar1.u8[2] = a.u8[2] * '\x02';
  cVar1.u8[3] = a.u8[3] * '\x02';
  cVar1.u8[4] = a.u8[4] * '\x02';
  cVar1.u8[5] = a.u8[5] * '\x02';
  cVar1.u8[6] = a.u8[6] * '\x02';
  cVar1.u8[7] = a.u8[7] * '\x02';
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = (int8_t)(a.u8[c] << n);
  return t;
}